

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall testing::Matcher<mp::PLTerm>::Matcher(Matcher<mp::PLTerm> *this,PLTerm value)

{
  MatcherBase<mp::PLTerm> local_30;
  BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40> local_18;
  
  (this->super_MatcherBase<mp::PLTerm>).impl_.value_ = (MatcherInterface<mp::PLTerm> *)0x0;
  (this->super_MatcherBase<mp::PLTerm>).impl_.link_.next_ =
       &(this->super_MatcherBase<mp::PLTerm>).impl_.link_;
  (this->super_MatcherBase<mp::PLTerm>)._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001c9998
  ;
  local_18.super_ExprBase.impl_ =
       (ExprBase)
       (ExprBase)value.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_;
  internal::EqMatcher::operator_cast_to_Matcher
            ((Matcher<mp::PLTerm> *)&local_30,(EqMatcher *)&local_18);
  internal::linked_ptr<const_testing::MatcherInterface<mp::PLTerm>_>::operator=
            (&(this->super_MatcherBase<mp::PLTerm>).impl_,&local_30.impl_);
  internal::MatcherBase<mp::PLTerm>::~MatcherBase(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }